

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

upb_MessageValue upb_MapIterator_Key(upb_Map *map,size_t iter)

{
  upb_MessageValue uVar1;
  upb_MessageValue ret;
  upb_strtable_iter i;
  upb_MessageValue local_28;
  upb_strtable_iter local_18;
  
  local_18.t = &map->table;
  local_18.index = iter;
  uVar1.str_val = upb_strtable_iter_key(&local_18);
  if ((long)map->key_size != 0) {
    memcpy(&local_28,uVar1.array_val,(long)map->key_size);
    uVar1 = local_28;
  }
  local_28 = uVar1;
  return local_28;
}

Assistant:

upb_MessageValue upb_MapIterator_Key(const upb_Map* map, size_t iter) {
  upb_strtable_iter i;
  upb_MessageValue ret;
  i.t = &map->table;
  i.index = iter;
  _upb_map_fromkey(upb_strtable_iter_key(&i), &ret, map->key_size);
  return ret;
}